

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall
Fl_Text_Display::wrapped_line_counter
          (Fl_Text_Display *this,Fl_Text_Buffer *buf,int startPos,int maxPos,int maxLines,
          bool startPosIsLineStart,int styleBufOffset,int *retPos,int *retLines,int *retLineStart,
          int *retLineEnd,bool countLastLineMissingNewLine)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int pos;
  int iVar6;
  int pos_00;
  int iVar7;
  char *pcVar8;
  undefined3 in_register_00000089;
  int iVar9;
  double dVar10;
  double local_68;
  int local_5c;
  
  iVar6 = this->mWrapMarginPix;
  if (iVar6 == 0) {
    iVar6 = (this->text_area).w;
  }
  if (CONCAT31(in_register_00000089,startPosIsLineStart) == 0) {
    startPos = line_start(this,startPos);
  }
  iVar3 = buf->mLength;
  bVar1 = false;
  if (startPos < iVar3) {
    local_68 = 0.0;
    local_5c = 0;
    pos_00 = 0;
    iVar7 = 0;
    iVar9 = startPos;
    pos = startPos;
    do {
      uVar2 = Fl_Text_Buffer::char_at(buf,pos);
      if (uVar2 == 10) {
        if (pos < maxPos) {
          pos_00 = pos_00 + 1;
          startPos = Fl_Text_Buffer::next_char(buf,pos);
          if (maxLines <= pos_00) {
            *retPos = startPos;
            *retLines = pos_00;
            *retLineStart = startPos;
            *retLineEnd = pos;
            return;
          }
          local_68 = 0.0;
          iVar7 = 0;
          iVar9 = startPos;
          goto LAB_001d38f3;
        }
        *retPos = maxPos;
LAB_001d3b80:
        *retLines = pos_00;
        *retLineStart = startPos;
        goto LAB_001d3b95;
      }
      if (pos < buf->mGapStart) {
        pcVar8 = buf->mBuf + pos;
      }
      else {
        pcVar8 = buf->mBuf + (((long)buf->mGapEnd + (long)pos) - (long)buf->mGapStart);
      }
      iVar7 = iVar7 + 1;
      dVar10 = measure_proportional_character(this,pcVar8,(int)local_68,pos + styleBufOffset);
      local_68 = local_68 + dVar10;
LAB_001d38f3:
      iVar4 = startPos;
      iVar3 = pos;
      if ((double)iVar6 < local_68) {
        for (; startPos <= iVar3; iVar3 = Fl_Text_Buffer::prev_char(buf,iVar3)) {
          uVar2 = Fl_Text_Buffer::char_at(buf,iVar3);
          if ((uVar2 == 0x20) || (uVar2 == 9)) {
            local_5c = Fl_Text_Buffer::next_char(buf,iVar3);
            iVar4 = Fl_Text_Buffer::next_char(buf,pos);
            iVar5 = Fl_Text_Buffer::next_char(buf,iVar3);
            iVar9 = startPos;
            if (iVar5 < iVar4) {
              iVar7 = 0;
              local_68 = 0.0;
              do {
                if (iVar5 < buf->mGapStart) {
                  pcVar8 = buf->mBuf + iVar5;
                }
                else {
                  pcVar8 = buf->mBuf + (((long)buf->mGapEnd + (long)iVar5) - (long)buf->mGapStart);
                }
                dVar10 = measure_proportional_character
                                   (this,pcVar8,(int)local_68,iVar5 + styleBufOffset);
                local_68 = local_68 + dVar10;
                iVar7 = iVar7 + 1;
                iVar5 = Fl_Text_Buffer::next_char(buf,iVar5);
              } while (iVar5 < iVar4);
            }
            else {
              local_68 = 0.0;
              iVar7 = 0;
            }
            break;
          }
        }
        iVar5 = iVar3;
        if (iVar3 <= startPos) {
          iVar5 = startPos;
        }
        if (iVar3 < startPos) {
          local_5c = Fl_Text_Buffer::next_char(buf,startPos);
          if (local_5c < pos) {
            local_5c = pos;
          }
          iVar7 = iVar7 + 1;
          local_68 = 0.0;
          if (iVar5 < buf->mLength) {
            if (iVar5 < buf->mGapStart) {
              pcVar8 = buf->mBuf + iVar5;
            }
            else {
              pcVar8 = buf->mBuf + (((long)buf->mGapEnd + (long)iVar5) - (long)buf->mGapStart);
            }
            local_68 = measure_proportional_character(this,pcVar8,0,styleBufOffset + pos);
          }
        }
        if (pos < maxPos) {
          pos_00 = pos_00 + 1;
          iVar4 = local_5c;
          iVar9 = local_5c;
          if (pos_00 < maxLines) goto LAB_001d3abd;
          if (iVar3 < startPos) {
            iVar6 = Fl_Text_Buffer::next_char(buf,startPos);
            maxPos = pos;
            if (iVar6 < pos) {
              iVar6 = pos;
            }
          }
          else {
            iVar6 = Fl_Text_Buffer::next_char(buf,iVar5);
            maxPos = iVar5;
          }
          *retPos = iVar6;
        }
        else {
          *retPos = maxPos;
          startPos = iVar9;
          if (local_5c <= maxPos) {
            startPos = local_5c;
          }
          pos_00 = pos_00 + (uint)(local_5c <= maxPos);
        }
        goto LAB_001d3b80;
      }
LAB_001d3abd:
      startPos = iVar4;
      pos = Fl_Text_Buffer::next_char(buf,pos);
      iVar3 = buf->mLength;
    } while (pos < iVar3);
    bVar1 = 0 < iVar7;
  }
  else {
    pos_00 = 0;
  }
  *retPos = iVar3;
  *retLines = pos_00;
  if ((countLastLineMissingNewLine) && (bVar1)) {
    iVar6 = Fl_Text_Buffer::next_char(buf,pos_00);
    *retLines = iVar6;
  }
  *retLineStart = startPos;
  maxPos = buf->mLength;
LAB_001d3b95:
  *retLineEnd = maxPos;
  return;
}

Assistant:

void Fl_Text_Display::wrapped_line_counter(Fl_Text_Buffer *buf, int startPos,
                                           int maxPos, int maxLines, bool startPosIsLineStart, int styleBufOffset,
                                           int *retPos, int *retLines, int *retLineStart, int *retLineEnd,
                                           bool countLastLineMissingNewLine) const {
  IS_UTF8_ALIGNED2(buf, startPos)
  IS_UTF8_ALIGNED2(buf, maxPos)

  int lineStart, newLineStart = 0, b, p, colNum, wrapMarginPix;
  int i, foundBreak;
  double width;
  int nLines = 0;
  unsigned int c;

  /* Set the wrap margin to the wrap column or the view width */
  if (mWrapMarginPix != 0) {
    wrapMarginPix = mWrapMarginPix;
  } else {
    wrapMarginPix = text_area.w;
  }

  /* Find the start of the line if the start pos is not marked as a
   line start. */
  if (startPosIsLineStart)
    lineStart = startPos;
  else
    lineStart = line_start(startPos);

  /*
   ** Loop until position exceeds maxPos or line count exceeds maxLines.
   ** (actually, continues beyond maxPos to end of line containing maxPos,
   ** in case later characters cause a word wrap back before maxPos)
   */
  colNum = 0;
  width = 0;
  for (p=lineStart; p<buf->length(); p=buf->next_char(p)) {
    c = buf->char_at(p);  // UCS-4

    /* If the character was a newline, count the line and start over,
     otherwise, add it to the width and column counts */
    if (c == '\n') {
      if (p >= maxPos) {
        *retPos = maxPos;
        *retLines = nLines;
        *retLineStart = lineStart;
        *retLineEnd = maxPos;
        return;
      }
      nLines++;
      int p1 = buf->next_char(p);
      if (nLines >= maxLines) {
        *retPos = p1;
        *retLines = nLines;
        *retLineStart = p1;
        *retLineEnd = p;
        return;
      }
      lineStart = p1;
      colNum = 0;
      width = 0;
    } else {
      const char *s = buf->address(p);
      colNum++;
      // FIXME: it is not a good idea to simply add character widths because on
      // some platforms, the width is a floating point value and depends on the
      // previous character as well.
      width += measure_proportional_character(s, (int)width, p+styleBufOffset);
    }

    /* If character exceeded wrap margin, find the break point and wrap there */
    if (width > wrapMarginPix) {
      foundBreak = false;
      for (b=p; b>=lineStart; b=buf->prev_char(b)) {
        c = buf->char_at(b);
        if (c == '\t' || c == ' ') {
          newLineStart = buf->next_char(b);
          colNum = 0;
          width = 0;
          int iMax = buf->next_char(p);
          for (i=buf->next_char(b); i<iMax; i = buf->next_char(i)) {
            width += measure_proportional_character(buf->address(i), (int)width,
                                                    i+styleBufOffset);
            colNum++;
          }
          foundBreak = true;
          break;
        }
      }
      if (b<lineStart) b = lineStart;
      if (!foundBreak) { /* no whitespace, just break at margin */
        newLineStart = max(p, buf->next_char(lineStart));
        colNum++;
	if (b >= buf->length()) { // STR #2730
	  width = 0;
	} else {
	  const char *s = buf->address(b);
	  width = measure_proportional_character(s, 0, p+styleBufOffset);
	}
      }
      if (p >= maxPos) {
        *retPos = maxPos;
        *retLines = maxPos < newLineStart ? nLines : nLines + 1;
        *retLineStart = maxPos < newLineStart ? lineStart : newLineStart;
        *retLineEnd = maxPos;
        return;
      }
      nLines++;
      if (nLines >= maxLines) {
        *retPos = foundBreak ? buf->next_char(b) : max(p, buf->next_char(lineStart));
        *retLines = nLines;
        *retLineStart = lineStart;
        *retLineEnd = foundBreak ? b : p;
        return;
      }
      lineStart = newLineStart;
    }
  }

  /* reached end of buffer before reaching pos or line target */
  *retPos = buf->length();
  *retLines = nLines;
  if (countLastLineMissingNewLine && colNum > 0)
    *retLines = buf->next_char(*retLines);
  *retLineStart = lineStart;
  *retLineEnd = buf->length();
}